

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

void __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>::SetIsPrototype
          (SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false> *this,
          DynamicObject *instance)

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  RecyclerWeakReference<Js::DynamicObject> *pRVar5;
  
  bVar1 = (this->super_DynamicTypeHandler).flags;
  if ((DAT_0145c366 == '\0') && (((bVar1 & 0x18) == 0 || (DAT_0145c365 == '\0')))) {
    DynamicTypeHandler::SetFlags(&this->super_DynamicTypeHandler,' ');
    return;
  }
  pRVar5 = (this->singletonInstance).ptr;
  if (pRVar5 != (RecyclerWeakReference<Js::DynamicObject> *)0x0 && (bVar1 & 0x10) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0xb45,"(!GetIsShared() || this->singletonInstance == nullptr)",
                                "!GetIsShared() || this->singletonInstance == nullptr");
    if (!bVar3) goto LAB_00c628af;
    *puVar4 = 0;
    pRVar5 = (this->singletonInstance).ptr;
  }
  if ((pRVar5 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) &&
     ((DynamicObject *)(pRVar5->super_RecyclerWeakReferenceBase).strongRef != instance)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0xb46,
                                "(this->singletonInstance == nullptr || this->singletonInstance->Get() == instance)"
                                ,
                                "this->singletonInstance == nullptr || this->singletonInstance->Get() == instance"
                               );
    if (!bVar3) {
LAB_00c628af:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  SetIsPrototype(this,instance,false);
  return;
}

Assistant:

void SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetIsPrototype(DynamicObject* instance)
    {
        // Don't return if IsPrototypeFlag is set, because we may still need to do a type transition and
        // set fixed bits.  If this handler is shared, this instance may not even be a prototype yet.
        // In this case we may need to convert to a non-shared type handler.
        if (!ChangeTypeOnProto() && !(GetIsOrMayBecomeShared() && IsolatePrototypes()))
        {
            SetFlags(IsPrototypeFlag);
            return;
        }

        Assert(!GetIsShared() || this->singletonInstance == nullptr);
        Assert(this->singletonInstance == nullptr || this->singletonInstance->Get() == instance);

        SetIsPrototype(instance, false);
    }